

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::assert_range_equals1(void)

{
  initializer_list<int> __l;
  initializer_list<long> __l_00;
  allocator_type local_e9;
  string expected;
  vector<int,_std::allocator<int>_> v;
  deque<long,_std::allocator<long>_> li;
  
  li.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x100000000;
  li.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_map_size =
       0x300000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&li;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&expected);
  expected.field_2._M_allocated_capacity = 2;
  expected.field_2._8_8_ = 4;
  expected._M_dataplus._M_p = (pointer)0x0;
  expected._M_string_length = 1;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&expected;
  std::deque<long,_std::allocator<long>_>::deque(&li,__l_00,&local_e9);
  expected._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  expected._M_string_length = CONCAT44(expected._M_string_length._4_4_,0x174);
  UnitTests::Assert::
  RangeEquals<std::deque<long,std::allocator<long>>&,std::vector<int,std::allocator<int>>&>
            ((Assert *)&expected,&li,&v);
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base
            (&li.super__Deque_base<long,_std::allocator<long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(assert_range_equals1)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            std::deque<long> li{0, 1, 2, 4};
            ASSERT_RANGE_EQUALS(li, v);
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();

            std::string expected = "error A1000: Assertion failure : Expected range [4] different to actual range [4]\n"
                                   "\telement[0] = (0,0)\n"
                                   "\telement[1] = (1,1)\n"
                                   "\telement[2] = (2,2)\n"
                                   "\telement[3] = (4,3) <--------- HERE\n";

            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_RANGE_EQUALS", __FILE__, __LINE__);
            }
        }
    }